

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<unsigned_long,kj::StringPtr>::Callbacks>::
insert<kj::HashMap<unsigned_long,kj::StringPtr>::Entry,unsigned_long&>
          (HashIndex<kj::HashMap<unsigned_long,kj::StringPtr>::Callbacks> *this,
          ArrayPtr<kj::HashMap<unsigned_long,_kj::StringPtr>::Entry> table,size_t pos,
          unsigned_long *params)

{
  uint uVar1;
  ulong uVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  uint uVar4;
  ulong uVar5;
  HashIndex<kj::HashMap<unsigned_long,_kj::StringPtr>::Callbacks> *this_00;
  uint *puVar6;
  uint uVar7;
  long lVar8;
  ulong *in_R9;
  uint *puVar9;
  Maybe<unsigned_long> MVar10;
  
  this_00 = (HashIndex<kj::HashMap<unsigned_long,_kj::StringPtr>::Callbacks> *)table.ptr;
  if ((ulong)(*(long *)(this_00 + 0x18) * 2) < (*(long *)(this_00 + 8) + pos) * 3 + 3) {
    HashIndex<kj::HashMap<unsigned_long,_kj::StringPtr>::Callbacks>::rehash(this_00,pos * 3 + 3);
  }
  uVar2 = *in_R9;
  if (uVar2 >> 0x20 == 0) {
    uVar4 = (uint)uVar2 * 0x8000 + ~(uint)uVar2;
    uVar4 = (uVar4 >> 0xc ^ uVar4) * 5;
    uVar4 = (uVar4 >> 4 ^ uVar4) * 0x809;
    uVar4 = uVar4 >> 0x10 ^ uVar4;
  }
  else {
    uVar5 = uVar2 * 0x40000 + ~uVar2;
    uVar5 = (uVar5 >> 0x1f ^ uVar5) * 0x15;
    uVar5 = (uVar5 >> 0xb ^ uVar5) * 0x41;
    uVar4 = (uint)(uVar5 >> 0x16) ^ (uint)uVar5;
  }
  aVar3 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)
          ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(this_00 + 0x10))->value;
  uVar7 = (int)*(long *)(this_00 + 0x18) - 1U & uVar4;
  puVar6 = (uint *)0x0;
  do {
    puVar9 = (uint *)(aVar3.value + (ulong)uVar7 * 8);
    uVar1 = puVar9[1];
    if (uVar1 == 1) {
      if (puVar6 == (uint *)0x0) {
        puVar6 = puVar9;
      }
    }
    else {
      if (uVar1 == 0) {
        if (puVar6 != (uint *)0x0) {
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + -1;
          puVar9 = puVar6;
        }
        *(ulong *)puVar9 = ((ulong)uVar4 | (long)params << 0x20) + 0x200000000;
        *this = (HashIndex<kj::HashMap<unsigned_long,kj::StringPtr>::Callbacks>)0x0;
        goto LAB_0017ab15;
      }
      if ((*puVar9 == uVar4) && (*(ulong *)(table.size_ + (ulong)(uVar1 - 2) * 0x18) == uVar2)) {
        *this = (HashIndex<kj::HashMap<unsigned_long,kj::StringPtr>::Callbacks>)0x1;
        *(ulong *)(this + 8) = (ulong)(uVar1 - 2);
LAB_0017ab15:
        MVar10.ptr.field_1.value = aVar3.value;
        MVar10.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar10.ptr;
      }
    }
    lVar8 = (ulong)uVar7 + 1;
    uVar7 = (uint)lVar8;
    if (lVar8 == *(long *)(this_00 + 0x18)) {
      uVar7 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash so that it's 1/3, i.e. double the buckets.
      // Note that rehashing also cleans up erased entries, so we may not actually be doubling if
      // there are a lot of erasures. Nevertheless, this gives us amortized constant time -- it
      // would take at least O(table.size()) more insertions (whether or not erasures occur)
      // before another rehash is needed.
      rehash((table.size() + 1) * 3);
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_SOME(s, erasedSlot) {
          --erasedCount;
          s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return kj::none;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == kj::none) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }